

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  iterator *piVar1;
  iterator *piVar2;
  FieldDescriptor *pFVar3;
  iterator *piVar4;
  iterator *piVar5;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  undefined1 uVar6;
  undefined8 in_RCX;
  _Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
  __comp;
  bool bVar7;
  iterator *piVar8;
  long extraout_RDX;
  FieldDescriptor **ppFVar9;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __first;
  long __depth_limit;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  _Var10;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  _Var11;
  ulong uVar12;
  long lVar13;
  _Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
  _Stack_48;
  _Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
  _Stack_40;
  
  piVar1 = (iterator *)a->ctrl_;
  __comp._M_comp =
       (_func_bool_FieldDescriptor_ptr_FieldDescriptor_ptr *)
       CONCAT71((int7)((ulong)in_RCX >> 8),piVar1 == (iterator *)0x0);
  if ((piVar1 == (iterator *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       piVar1 == (iterator *)0x0) || (-1 < (char)*(code *)&piVar1->ctrl_)) {
    __comp._M_comp = (_func_bool_FieldDescriptor_ptr_FieldDescriptor_ptr *)b->ctrl_;
    if ((__comp._M_comp != absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>
         && (iterator *)__comp._M_comp != (iterator *)0x0) &&
       ((char)*(code *)&((iterator *)__comp._M_comp)->ctrl_ < '\0')) goto LAB_0032a980;
    if (piVar1 == (iterator *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        __comp._M_comp == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)
    {
LAB_0032a973:
      return piVar1 == (iterator *)__comp._M_comp;
    }
    if ((piVar1 ==
        (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) ==
        (__comp._M_comp == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)
       ) {
      if (piVar1 == (iterator *)0x0 || (iterator *)__comp._M_comp == (iterator *)0x0)
      goto LAB_0032a973;
      if (((iterator *)__comp._M_comp == (iterator *)&kSooControl) ==
          (piVar1 == (iterator *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        piVar2 = (iterator *)(b->field_1).slot_;
        if (piVar1 == (iterator *)&kSooControl) {
          bVar7 = a == piVar2;
        }
        else {
          piVar8 = piVar2;
          piVar4 = (iterator *)__comp._M_comp;
          piVar5 = a;
          if (__comp._M_comp < piVar1) {
            piVar8 = a;
            piVar4 = piVar1;
            piVar5 = piVar2;
          }
          b = (iterator *)CONCAT71((int7)((ulong)piVar4 >> 8),piVar4 < piVar5);
          bVar7 = piVar5 <= piVar8 && piVar4 < piVar5;
        }
        if (bVar7) goto LAB_0032a973;
      }
      goto LAB_0032a98a;
    }
  }
  else {
    operator==();
LAB_0032a980:
    operator==();
  }
  operator==();
LAB_0032a98a:
  operator==();
  uVar12 = (long)b - (long)a >> 3;
  uVar6 = extraout_AL;
  if (0x10 < (long)uVar12) {
    __depth_limit = extraout_RDX;
    do {
      bVar7 = __depth_limit == 0;
      __depth_limit = __depth_limit + -1;
      if (bVar7) {
        _Stack_48._M_comp = __comp._M_comp;
        _Stack_40._M_comp = __comp._M_comp;
        std::
        __make_heap<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                  ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    )a,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                        )b,&_Stack_40);
        std::
        __sort_heap<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                  ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    )a,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                        )b,&_Stack_48);
        return (bool)extraout_AL_01;
      }
      std::
      __move_median_to_first<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )a,(FieldDescriptor **)((long)a + 8),
                 (FieldDescriptor **)((long)a + (uVar12 & 0xfffffffffffffffe) * 4),
                 (FieldDescriptor **)((long)b + -8),__comp);
      _Var10._M_current = (FieldDescriptor **)b;
      _Var11._M_current = (FieldDescriptor **)((long)a + 8);
      while( true ) {
        lVar13 = (-8 - (long)a) + (long)_Var11._M_current;
        __first._M_current = _Var11._M_current + -1;
        do {
          ppFVar9 = __first._M_current;
          __first._M_current = ppFVar9 + 1;
          bVar7 = (*__comp._M_comp)(ppFVar9[1],*(FieldDescriptor **)a);
          lVar13 = lVar13 + 8;
        } while (bVar7);
        _Var11._M_current = ppFVar9 + 2;
        do {
          ppFVar9 = _Var10._M_current + -1;
          _Var10._M_current = _Var10._M_current + -1;
          bVar7 = (*__comp._M_comp)(*(FieldDescriptor **)a,*ppFVar9);
        } while (bVar7);
        if (_Var10._M_current <= __first._M_current) break;
        pFVar3 = *__first._M_current;
        *__first._M_current = *_Var10._M_current;
        *_Var10._M_current = pFVar3;
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                (__first,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                          )b,__depth_limit,__comp);
      uVar12 = lVar13 >> 3;
      b = (iterator *)__first._M_current;
      uVar6 = extraout_AL_00;
    } while (0x10 < (long)uVar12);
  }
  return (bool)uVar6;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }